

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O2

boolean its_dead(int rx,int ry,int *resp,obj *tobj)

{
  obj *poVar1;
  boolean bVar2;
  obj *poVar3;
  trap *ptVar4;
  char *pcVar5;
  char *pcVar6;
  
  bVar2 = can_reach_floor();
  if (bVar2 == '\0') {
    return '\0';
  }
  if ((((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
      ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) ||
     (poVar3 = sobj_at(0x10e,level,rx,ry), poVar3 == (obj *)0x0)) {
    if ((urole.malenum == 0x15e) &&
       ((poVar3 = sobj_at(0x10e,level,rx,ry), poVar3 != (obj *)0x0 ||
        (poVar3 = sobj_at(0x215,level,rx,ry), poVar3 != (obj *)0x0)))) {
      poVar1 = level->objects[rx][ry];
      if (poVar1->otyp == 0x215) {
        poVar3 = poVar1;
      }
      if (poVar3->otyp != 0x10e) {
        ptVar4 = t_at(level,rx,ry);
        pcVar5 = mons_mname(mons + poVar3->corpsenm);
        pcVar5 = The(pcVar5);
        if (ptVar4 == (trap *)0x0) {
          pcVar6 = "excellent";
        }
        else {
          pcVar6 = "excellent";
          if ((ptVar4->field_0x8 & 0x1f) == 0x14) {
            pcVar6 = "extraordinary";
          }
        }
        pline("%s appears to be in %s health for a statue.",pcVar5,pcVar6);
        return '\x01';
      }
      pcVar5 = "that";
      if (u.uy == ry && u.ux == rx) {
        pcVar5 = "this";
      }
      pcVar6 = "You determine that %s unfortunate being is dead.";
    }
    else {
      poVar3 = sobj_at(0x10f,level,rx,ry);
      if (poVar3 == (obj *)0x0) {
        poVar3 = sobj_at(0xdc,level,rx,ry);
        if (poVar3 != (obj *)0x0) {
          pick_lock(tobj,rx,ry,'\0','\0');
          return '\x01';
        }
        return '\0';
      }
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        if ((400 < moves - poVar3->age) || ((long)poVar3->corpsenm == -1)) {
          pline("The egg doesn\'t make much noise at all.");
          return '\x01';
        }
        pcVar5 = mons_mname(mons + poVar3->corpsenm);
      }
      else {
        pcVar5 = rndmonnam();
      }
      pcVar6 = "You listen to the egg and guess... %s?";
    }
    pline(pcVar6,pcVar5);
  }
  else {
    You_hear("a voice say, \"It\'s dead, Jim.\"");
    *resp = 1;
  }
  return '\x01';
}

Assistant:

static boolean its_dead(int rx, int ry, int *resp, struct obj *tobj)
{
	struct obj *otmp;
	struct trap *ttmp;

	if (!can_reach_floor()) return FALSE;

	/* additional stethoscope messages from jyoung@apanix.apana.org.au */
	if (Hallucination && sobj_at(CORPSE, level, rx, ry)) {
	    /* (a corpse doesn't retain the monster's sex,
	       so we're forced to use generic pronoun here) */
	    You_hear("a voice say, \"It's dead, Jim.\"");
	    *resp = 1;
	    return TRUE;
	} else if (Role_if (PM_HEALER) && ((otmp = sobj_at(CORPSE, level, rx, ry)) != 0 ||
				    (otmp = sobj_at(STATUE, level, rx, ry)) != 0)) {
	    /* possibly should check uppermost {corpse,statue} in the pile
	       if both types are present, but it's not worth the effort */
	    if (vobj_at(rx, ry)->otyp == STATUE) otmp = vobj_at(rx, ry);
	    if (otmp->otyp == CORPSE) {
		pline("You determine that %s unfortunate being is dead.",
		    (rx == u.ux && ry == u.uy) ? "this" : "that");
	    } else {
		ttmp = t_at(level, rx, ry);
		pline("%s appears to be in %s health for a statue.",
		      The(mons_mname(&mons[otmp->corpsenm])),
		      (ttmp && ttmp->ttyp == STATUE_TRAP) ?
			"extraordinary" : "excellent");
	    }
	    return TRUE;
	}

	/* Listening to eggs is a little fishy, but so is stethoscopes
	   detecting alignment.  The overcomplex wording is because all
	   the monster-naming functions operate on actual instances of
	   the monsters, and we're dealing with just an index so we can
	   avoid things like "a owlbear", etc. */
	if ((otmp = sobj_at(EGG, level, rx, ry))) {
	    if (Hallucination) {
		pline("You listen to the egg and guess... %s?", rndmonnam());
	    } else {
		if (stale_egg(otmp) || otmp->corpsenm == NON_PM) {
		    pline("The egg doesn't make much noise at all.");
		} else {
		    pline("You listen to the egg and guess... %s?",
			  mons_mname(&mons[otmp->corpsenm]));
		}
	    }
	    return TRUE;
	}

	/* Using a stethoscope on a safe may crack the safe open. */
	if ((otmp = sobj_at(IRON_SAFE, level, rx, ry))) {
	    pick_lock(tobj, rx, ry, FALSE, FALSE);
	    return TRUE;
	}

	return FALSE;
}